

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestComparisonsF<Counter<unsigned_short,16u>>(void)

{
  Counter<unsigned_short,_16U> CVar1;
  Counter<unsigned_short,_16U> local_5ce;
  Counter<unsigned_short,_16U> local_5cc;
  Counter<unsigned_short,_16U> local_5ca;
  Counter<unsigned_short,_16U> local_5c8;
  Counter<unsigned_short,_16U> local_5c6;
  Counter<unsigned_short,_16U> local_5c4;
  Counter<unsigned_short,_16U> local_5c2;
  Counter<unsigned_short,_16U> local_5c0;
  Counter<unsigned_short,_16U> local_5be;
  Counter<unsigned_short,_16U> local_5bc;
  Counter<unsigned_short,_16U> local_5ba;
  Counter<unsigned_short,_16U> local_5b8;
  Counter<unsigned_short,_16U> local_5b6;
  Counter<unsigned_short,_16U> local_5b4;
  Counter<unsigned_short,_16U> local_5b2;
  Counter<unsigned_short,_16U> local_5b0;
  Counter<unsigned_short,_16U> local_5ae;
  Counter<unsigned_short,_16U> local_5ac;
  Counter<unsigned_short,_16U> local_5aa;
  Counter<unsigned_short,_16U> local_5a8;
  Counter<unsigned_short,_16U> local_5a6;
  Counter<unsigned_short,_16U> local_5a4;
  Counter<unsigned_short,_16U> local_5a2;
  Counter<unsigned_short,_16U> local_5a0;
  Counter<unsigned_short,_16U> local_59e;
  Counter<unsigned_short,_16U> local_59c;
  Counter<unsigned_short,_16U> local_59a;
  Counter<unsigned_short,_16U> local_598;
  Counter<unsigned_short,_16U> local_596;
  uint local_594;
  Counter<unsigned_short,_16U> local_58e;
  uint ii_1;
  Counter<unsigned_short,_16U> local_588;
  Counter<unsigned_short,_16U> local_586;
  Counter<unsigned_short,_16U> local_584;
  Counter<unsigned_short,_16U> local_582;
  Counter<unsigned_short,_16U> local_580;
  Counter<unsigned_short,_16U> local_57e;
  Counter<unsigned_short,_16U> local_57c;
  Counter<unsigned_short,_16U> local_57a;
  Counter<unsigned_short,_16U> local_578;
  Counter<unsigned_short,_16U> local_576;
  Counter<unsigned_short,_16U> local_574;
  Counter<unsigned_short,_16U> local_572;
  Counter<unsigned_short,_16U> local_570;
  Counter<unsigned_short,_16U> local_56e;
  Counter<unsigned_short,_16U> local_56c;
  Counter<unsigned_short,_16U> local_56a;
  Counter<unsigned_short,_16U> local_568;
  Counter<unsigned_short,_16U> local_566;
  Counter<unsigned_short,_16U> local_564;
  Counter<unsigned_short,_16U> local_562;
  Counter<unsigned_short,_16U> local_560;
  Counter<unsigned_short,_16U> local_55e;
  Counter<unsigned_short,_16U> local_55c;
  Counter<unsigned_short,_16U> local_55a;
  Counter<unsigned_short,_16U> local_558;
  Counter<unsigned_short,_16U> local_556;
  uint local_554;
  uint local_550;
  uint ii;
  uint sep;
  Counter<unsigned_short,_16U> local_544;
  Counter<unsigned_short,_16U> local_542;
  Counter<unsigned_short,_16U> local_540;
  Counter<unsigned_short,_16U> local_53e;
  Counter<unsigned_short,_16U> local_53c;
  bool local_539;
  Counter<unsigned_short,_16U> c;
  Counter<unsigned_short,_16U> b;
  Counter<unsigned_short,_16U> a;
  unsigned_short d_20;
  unsigned_short d_19;
  unsigned_short d_18;
  unsigned_short d_2;
  unsigned_short d_1;
  unsigned_short d;
  unsigned_short d_26;
  unsigned_short d_25;
  unsigned_short d_24;
  unsigned_short d_23;
  unsigned_short d_22;
  unsigned_short d_21;
  unsigned_short d_8;
  unsigned_short d_7;
  unsigned_short d_6;
  unsigned_short d_5;
  unsigned_short d_4;
  unsigned_short d_3;
  unsigned_short d_29;
  unsigned_short d_28;
  unsigned_short d_27;
  unsigned_short d_11;
  unsigned_short d_10;
  unsigned_short d_9;
  unsigned_short d_35;
  unsigned_short d_34;
  unsigned_short d_33;
  unsigned_short d_32;
  unsigned_short d_31;
  unsigned_short d_30;
  unsigned_short d_17;
  unsigned_short d_16;
  unsigned_short d_15;
  unsigned_short d_14;
  unsigned_short d_13;
  unsigned_short d_12;
  unsigned_short oldValue_1;
  unsigned_short oldValue;
  unsigned_short oldValue_3;
  unsigned_short oldValue_2;
  
  Counter<unsigned_short,_16U>::Counter(&local_53c,2);
  Counter<unsigned_short,_16U>::Counter(&local_53e,2);
  Counter<unsigned_short,_16U>::Counter(&local_540,3);
  Counter<unsigned_short,_16U>::Counter(&local_542,&local_53e);
  if (local_53c.Value == local_542.Value) {
    Counter<unsigned_short,_16U>::Counter(&local_544,&local_540);
    if (local_53e.Value == local_544.Value) {
      local_539 = false;
    }
    else {
      Counter<unsigned_short,_16U>::Counter
                ((Counter<unsigned_short,_16U> *)((long)&sep + 2),&local_540);
      Counter<unsigned_short,_16U>::operator=(&local_53e,(ThisType *)((long)&sep + 2));
      Counter<unsigned_short,_16U>::Counter((Counter<unsigned_short,_16U> *)&sep,&local_540);
      if (local_53e.Value == (unsigned_short)sep) {
        Counter<unsigned_short,_16U>::Counter
                  ((Counter<unsigned_short,_16U> *)((long)&ii + 2),&local_53e);
        if (local_53c.Value == ii._2_2_) {
          local_539 = false;
        }
        else {
          for (local_550 = 0; local_550 < 3; local_550 = local_550 + 1) {
            Counter<unsigned_short,_16U>::operator=(&local_53c,-(short)local_550 - 1);
            Counter<unsigned_short,_16U>::operator=(&local_53e,0);
            Counter<unsigned_short,_16U>::operator=(&local_540,(short)local_550 + 1);
            for (local_554 = 0; local_554 < 1000; local_554 = local_554 + 1) {
              Counter<unsigned_short,_16U>::Counter(&local_556,&local_53c);
              if (local_53c.Value != local_556.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_558,&local_53e);
              if (local_53e.Value != local_558.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_55a,&local_540);
              if (local_540.Value != local_55a.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_55c,&local_53e);
              if (local_53c.Value == local_55c.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_55e,&local_540);
              if (local_53c.Value == local_55e.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_560,&local_53c);
              if (local_53e.Value == local_560.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_562,&local_540);
              if (local_53e.Value == local_562.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_564,&local_53c);
              if (local_540.Value == local_564.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_566,&local_53e);
              if (local_540.Value == local_566.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_568,&local_53e);
              if ((ushort)(local_53c.Value - local_568.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_56a,&local_540);
              if ((ushort)(local_53c.Value - local_56a.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_56c,&local_540);
              if ((ushort)(local_53e.Value - local_56c.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_56e,&local_53e);
              if (0x7fff < (ushort)(local_56e.Value - local_53c.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_570,&local_540);
              if (0x7fff < (ushort)(local_570.Value - local_53c.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_572,&local_540);
              if (0x7fff < (ushort)(local_572.Value - local_53e.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_574,&local_53c);
              if (0x7fff < (ushort)(local_574.Value - local_53c.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_576,&local_53e);
              if (0x7fff < (ushort)(local_576.Value - local_53e.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_578,&local_540);
              if (0x7fff < (ushort)(local_578.Value - local_540.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_57a,&local_53c);
              if ((ushort)(local_57a.Value - local_53e.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_57c,&local_53c);
              if ((ushort)(local_57c.Value - local_540.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_57e,&local_53e);
              if ((ushort)(local_57e.Value - local_540.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_580,&local_53c);
              if (0x7fff < (ushort)(local_53e.Value - local_580.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_582,&local_53c);
              if (0x7fff < (ushort)(local_540.Value - local_582.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_584,&local_53e);
              if (0x7fff < (ushort)(local_540.Value - local_584.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_586,&local_53c);
              if (0x7fff < (ushort)(local_53c.Value - local_586.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_588,&local_53e);
              if (0x7fff < (ushort)(local_53e.Value - local_588.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter
                        ((Counter<unsigned_short,_16U> *)((long)&ii_1 + 2),&local_540);
              CVar1.Value = local_53c.Value;
              if (0x7fff < (ushort)(local_540.Value - ii_1._2_2_)) {
                return false;
              }
              local_53c.Value = local_53c.Value + 1;
              Counter<unsigned_short,_16U>::Counter
                        ((Counter<unsigned_short,_16U> *)&ii_1,CVar1.Value);
              CVar1.Value = local_540.Value;
              local_53e.Value = local_53e.Value + 1;
              local_540.Value = local_540.Value + 1;
              Counter<unsigned_short,_16U>::Counter(&local_58e,CVar1.Value);
            }
            for (local_594 = 0; local_594 < 2000; local_594 = local_594 + 1) {
              Counter<unsigned_short,_16U>::Counter(&local_596,&local_53c);
              if (local_53c.Value != local_596.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_598,&local_53e);
              if (local_53e.Value != local_598.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_59a,&local_540);
              _c = &local_59a;
              if (local_540.Value != local_59a.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_59c,&local_53e);
              if (local_53c.Value == local_59c.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_59e,&local_540);
              if (local_53c.Value == local_59e.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5a0,&local_53c);
              if (local_53e.Value == local_5a0.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5a2,&local_540);
              if (local_53e.Value == local_5a2.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5a4,&local_53c);
              if (local_540.Value == local_5a4.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5a6,&local_53e);
              if (local_540.Value == local_5a6.Value) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5a8,&local_53e);
              if ((ushort)(local_53c.Value - local_5a8.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5aa,&local_540);
              if ((ushort)(local_53c.Value - local_5aa.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5ac,&local_540);
              if ((ushort)(local_53e.Value - local_5ac.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5ae,&local_53e);
              if (0x7fff < (ushort)(local_5ae.Value - local_53c.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5b0,&local_540);
              if (0x7fff < (ushort)(local_5b0.Value - local_53c.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5b2,&local_540);
              if (0x7fff < (ushort)(local_5b2.Value - local_53e.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5b4,&local_53c);
              if (0x7fff < (ushort)(local_5b4.Value - local_53c.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5b6,&local_53e);
              if (0x7fff < (ushort)(local_5b6.Value - local_53e.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5b8,&local_540);
              if (0x7fff < (ushort)(local_5b8.Value - local_540.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5ba,&local_53c);
              if ((ushort)(local_5ba.Value - local_53e.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5bc,&local_53c);
              if ((ushort)(local_5bc.Value - local_540.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5be,&local_53e);
              if ((ushort)(local_5be.Value - local_540.Value) < 0x8000) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5c0,&local_53c);
              if (0x7fff < (ushort)(local_53e.Value - local_5c0.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5c2,&local_53c);
              if (0x7fff < (ushort)(local_540.Value - local_5c2.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5c4,&local_53e);
              if (0x7fff < (ushort)(local_540.Value - local_5c4.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5c6,&local_53c);
              if (0x7fff < (ushort)(local_53c.Value - local_5c6.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5c8,&local_53e);
              if (0x7fff < (ushort)(local_53e.Value - local_5c8.Value)) {
                return false;
              }
              Counter<unsigned_short,_16U>::Counter(&local_5ca,&local_540);
              CVar1.Value = local_53c.Value;
              if (0x7fff < (ushort)(local_540.Value - local_5ca.Value)) {
                return false;
              }
              local_53c.Value = local_53c.Value - 1;
              Counter<unsigned_short,_16U>::Counter(&local_5cc,CVar1.Value);
              CVar1.Value = local_540.Value;
              local_53e.Value = local_53e.Value - 1;
              local_540.Value = local_540.Value - 1;
              Counter<unsigned_short,_16U>::Counter(&local_5ce,CVar1.Value);
            }
          }
          local_539 = true;
        }
      }
      else {
        local_539 = false;
      }
    }
  }
  else {
    local_539 = false;
  }
  return local_539;
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}